

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

void block_free_heap(AD *ad)

{
  ulongi uVar1;
  AD *pAVar2;
  AD *pAVar3;
  _AD *p_Var4;
  AD *pAVar5;
  _AD **pp_Var6;
  AD **ppAVar7;
  
  if (ma_hused != (AD *)0x0) {
    pAVar2 = (AD *)0x0;
    p_Var4 = ma_hused;
    do {
      if (pAVar2 < p_Var4) {
        pAVar2 = p_Var4;
      }
      p_Var4 = p_Var4->next;
    } while (p_Var4 != (_AD *)0x0);
    if (pAVar2 != (AD *)0x0) {
      ma_hp = pAVar2->name + (pAVar2->nbytes - 0x10);
      if (ma_hfree != (AD *)0x0) {
        pAVar5 = (AD *)0x0;
        pAVar3 = ma_hfree;
        do {
          if (pAVar2 < pAVar3) {
            ppAVar7 = &pAVar5->next;
            p_Var4 = pAVar3->next;
            if (pAVar5 == (AD *)0x0) {
              ppAVar7 = &ma_hfree;
            }
            *ppAVar7 = p_Var4;
            pAVar3 = pAVar5;
          }
          else {
            p_Var4 = pAVar3->next;
          }
          pAVar5 = pAVar3;
          pAVar3 = p_Var4;
        } while (p_Var4 != (_AD *)0x0);
      }
      pAVar3 = ma_hfree;
      if (pAVar2 <= ad) {
        return;
      }
      if (ma_hfree == (AD *)0x0) {
        ad->next = (_AD *)0x0;
        ma_hfree = ad;
      }
      else {
        pAVar2 = ma_hfree;
        if (ad < ma_hfree) {
          pAVar5 = (AD *)0x0;
        }
        else {
          do {
            pAVar5 = pAVar2;
            pAVar2 = pAVar5->next;
            if (pAVar2 == (AD *)0x0) {
              pAVar5->next = ad;
              ad->next = (_AD *)0x0;
              goto LAB_0015bb66;
            }
          } while (pAVar2 <= ad);
        }
        pp_Var6 = &ma_hfree;
        if (pAVar5 != (AD *)0x0) {
          pp_Var6 = &pAVar5->next;
        }
        *pp_Var6 = ad;
        ad->next = pAVar2;
        pAVar3 = ma_hfree;
LAB_0015bb66:
        ad = pAVar3;
        if (pAVar3 == (AD *)0x0) {
          return;
        }
      }
      do {
        uVar1 = ad->nbytes;
        pAVar2 = ad->next;
        if ((AD *)(ad->name + (uVar1 - 0x10)) == ad->next) {
          ad->nbytes = *(long *)(ad->name + uVar1 + 0x28) + uVar1;
          ad->next = *(_AD **)(ad->name + uVar1 + 0x30);
          pAVar2 = ad;
        }
        ad = pAVar2;
      } while (pAVar2 != (AD *)0x0);
      return;
    }
  }
  ma_hp = ma_segment;
  ma_hfree = (AD *)0x0;
  return;
}

Assistant:

private void block_free_heap(ad)
    AD        *ad;        /* AD to free */
{
    AD        *ad2;        /* traversal pointer */
    AD        *max_ad;    /* rightmost AD */

    /* find rightmost heap block */
    for (max_ad = (AD *)NULL, ad2 = ma_hused; ad2; ad2 = ad2->next)
    {
        if (ad2 > max_ad)
            max_ad = ad2;
    }

    if (max_ad)
    {
        /* at least 1 block is in use */

        /* set ma_hp to first address past end of max_ad */
        ma_hp = (Pointer)max_ad + max_ad->nbytes;

        /* delete any free list blocks that are no longer in heap region */
	void (*action)(AD *);
	action= NULL;
        (void)list_delete_many(
            &ma_hfree,
            ad_gt,
            (Pointer)max_ad,
            action);

        /* if ad is in the heap region, add it to free list */
        if (ad < max_ad)
        {
            list_insert_ordered(ad, &ma_hfree, ad_lt);
            list_coalesce(ma_hfree);
        }
    }
    else
    {
        /* no blocks are in use */

        /* set ma_hp to start of segment */
        ma_hp = ma_segment;

        /* clear the free list */
        ma_hfree = (AD *)NULL;
    }
}